

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameEngine::calculateCells(GameEngine *this)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  TypeName TVar4;
  element_type *this_00;
  reference this_01;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar5;
  __shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *this_04;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *this_05;
  __shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_06;
  element_type *peVar6;
  int32_t local_a0;
  int32_t local_9c;
  int32_t carnivore;
  int32_t herbivore;
  int32_t yPos;
  int32_t xPos;
  shared_ptr<Population> *population;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__range2_1;
  shared_ptr<Player> *player;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *__range1_1;
  shared_ptr<CellType> *cell;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *__range2;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *row;
  iterator __end1;
  iterator __begin1;
  element_type *__range1;
  GameEngine *this_local;
  
  this_00 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  __end1 = Map::begin(this_00);
  row = (vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *)
        Map::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_*,_std::vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>_>
                                *)&row);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_*,_std::vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
             begin(this_01);
    cell = (shared_ptr<CellType> *)
           std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::end
                     (this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::shared_ptr<CellType>_*,_std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>
                                  *)&cell);
      if (!bVar1) break;
      this_02 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<CellType>_*,_std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>
                ::operator*(&__end2);
      peVar5 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_02);
      CellType::setHerbivoreCount(peVar5,0);
      peVar5 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_02);
      CellType::setCarnivoreCount(peVar5,0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CellType>_*,_std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_*,_std::vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::begin
                       (&this->players);
  player = (shared_ptr<Player> *)
           std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::end
                     (&this->players);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                        *)&player);
    if (!bVar1) break;
    this_03 = (__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
              ::operator*(&__end1_1);
    this_04 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (this_03);
    this_05 = Player::GetPlayerPopulations(this_04);
    __end2_1 = std::
               vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::
               begin(this_05);
    population = (shared_ptr<Population> *)
                 std::
                 vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 ::end(this_05);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                          *)&population);
      if (!bVar1) break;
      this_06 = (__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                ::operator*(&__end2_1);
      peVar6 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_06);
      iVar2 = Population::GetXPos(peVar6);
      peVar6 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_06);
      iVar3 = Population::GetYPos(peVar6);
      local_9c = 0;
      local_a0 = 0;
      peVar6 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_06);
      TVar4 = Population::GetType(peVar6);
      if (TVar4 == CARNIVORE) {
        peVar6 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_06);
        local_a0 = Population::GetAnimalAmount(peVar6);
      }
      else {
        peVar6 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_06);
        local_9c = Population::GetAnimalAmount(peVar6);
      }
      calculateCell(this,(long)iVar2,(long)iVar3,local_a0,local_9c);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void GameEngine::calculateCells() {
  for (auto &row : *map) {
    for (auto &cell : row) {
      cell->setHerbivoreCount(0);
      cell->setCarnivoreCount(0);
    }
  }

  for (const auto &player : players) {
    for (const auto &population : player->GetPlayerPopulations()) {
      int32_t xPos = population->GetXPos();
      int32_t yPos = population->GetYPos();

      int32_t herbivore = 0, carnivore = 0;

      if (population->GetType() == Population::TypeName::CARNIVORE) {
        carnivore += population->GetAnimalAmount();
      } else {
        herbivore += population->GetAnimalAmount();
      }

      calculateCell(xPos, yPos, carnivore, herbivore);
    }
  }
}